

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_strings.hpp
# Opt level: O2

Elf_Word __thiscall
ELFIO::string_section_accessor_template<ELFIO::section>::add_string
          (string_section_accessor_template<ELFIO::section> *this,char *str)

{
  uint uVar1;
  ulong in_RAX;
  size_t sVar2;
  Elf_Word EVar3;
  ulong uStack_28;
  char empty_string;
  
  EVar3 = 0;
  if ((str != (char *)0x0) && (this->string_section != (section *)0x0)) {
    uStack_28 = in_RAX;
    uVar1 = (*this->string_section->_vptr_section[0x13])();
    if (uVar1 == 0) {
      uStack_28 = uStack_28 & 0xffffffffffffff;
      (*this->string_section->_vptr_section[0x1c])(this->string_section,&empty_string,1);
      uVar1 = 1;
    }
    sVar2 = strlen(str);
    if ((sVar2 < 0xffffffff) && (EVar3 = 0, (uint)sVar2 < ~uVar1)) {
      (*this->string_section->_vptr_section[0x1c])(this->string_section,str,sVar2 + 1);
      EVar3 = uVar1;
    }
  }
  return EVar3;
}

Assistant:

Elf_Word add_string( const char* str )
    {
        if ( !str ) {
            return 0; // Return index of empty string for null input
        }

        Elf_Word current_position = 0;

        if ( string_section ) {
            // Strings are added to the end of the current section data
            current_position =
                static_cast<Elf_Word>( string_section->get_size() );

            if ( current_position == 0 ) {
                char empty_string = '\0';
                string_section->append_data( &empty_string, 1 );
                current_position++;
            }

            // Calculate string length and check for overflow
            size_t str_len = std::strlen( str );
            if ( str_len > std::numeric_limits<Elf_Word>::max() - 1 ) {
                return 0; // String too long
            }

            // Check if appending would overflow section size
            Elf_Word append_size = static_cast<Elf_Word>( str_len + 1 );
            if ( append_size >
                 std::numeric_limits<Elf_Word>::max() - current_position ) {
                return 0; // Would overflow section size
            }

            string_section->append_data( str, append_size );
        }

        return current_position;
    }